

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall QPDF::JSONReactor::~JSONReactor(JSONReactor *this)

{
  JSONReactor *this_local;
  
  ~JSONReactor(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

~JSONReactor() override = default;